

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_3d5c7::ImageManager::~ImageManager(ImageManager *this)

{
  pointer ppRVar1;
  pointer pIVar2;
  Image *pIVar3;
  CopyForm1 p_Var4;
  ulong uVar5;
  long lVar6;
  pointer ppCVar7;
  
  for (ppCVar7 = (this->_input).
                 super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar7 !=
      (this->_input).
      super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
    operator_delete(*ppCVar7);
  }
  lVar6 = 0;
  for (uVar5 = 0;
      ppRVar1 = (this->_output).
                super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_output).
                            super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3);
      uVar5 = uVar5 + 1) {
    pIVar2 = (this->_outputClone).
             super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar3 = ppRVar1[uVar5]->data;
    p_Var4 = ImageTypeManager::convert(this->_registrator,(&pIVar2->_type)[lVar6],pIVar3->_type);
    (*p_Var4)((Image *)((long)&pIVar2->_vptr_ImageTemplate + lVar6),pIVar3);
    operator_delete((this->_output).
                    super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5]);
    lVar6 = lVar6 + 0x28;
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&this->_outputClone);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&this->_inputClone);
  ppRVar1 = (this->_output).
            super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar1 != (pointer)0x0) {
    operator_delete(ppRVar1);
  }
  ppCVar7 = (this->_input).
            super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar7 != (pointer)0x0) {
    operator_delete(ppCVar7);
    return;
  }
  return;
}

Assistant:

~ImageManager()
        {
            for ( std::vector<ConstReferenceOwner *>::iterator data = _input.begin(); data != _input.end(); ++data )
                delete *data;

            for ( size_t i = 0u; i < _output.size(); ++i ) {
                _restore( _outputClone[i], _output[i]->data );

                delete _output[i];
            }
        }